

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new_stats(void)

{
  void *pvVar1;
  size_t _size;
  parasail_result_t *result;
  
  result = parasail_result_new();
  if (result == (parasail_result_t *)0x0) {
    result = (parasail_result_t *)0x0;
  }
  else {
    pvVar1 = malloc(0x18);
    (result->field_4).extra = pvVar1;
    if ((result->field_4).extra == (void *)0x0) {
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_stats",0x18);
      result = (parasail_result_t *)0x0;
    }
  }
  return result;
}

Assistant:

parasail_result_t* parasail_result_new_stats()
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    /* allocate only tables */
    PARASAIL_NEW(result->stats, parasail_result_extra_stats_t);

    return result;
}